

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O3

void SEM_Stmt(ast *node)

{
  int iVar1;
  ast *paVar2;
  attr *paVar3;
  attr *b;
  
  paVar2 = child(node,1);
  iVar1 = paVar2->type;
  if (iVar1 < 0x118) {
    if (iVar1 == -0x2704) {
      SEM_CompSt(paVar2,(field_t *)0x0);
      return;
    }
    if (iVar1 == -0x26fd) {
      SEM_Exp(paVar2);
      return;
    }
  }
  else {
    if (iVar1 == 0x118) {
      paVar2 = sibling(paVar2,1);
      paVar3 = findfunc(cur_func);
      if (paVar3 == (attr *)0x0) {
        paVar3 = (attr *)0x0;
      }
      else {
        paVar3 = ((paVar3->field_1).function)->return_type;
      }
      b = SEM_Exp(paVar2);
      if (b != (attr *)0x0) {
        iVar1 = isequal(paVar3,b);
        if (iVar1 == 0) {
          semerror(8,paVar2->pos->first_line,semErrorMsg[8]);
          return;
        }
      }
      return;
    }
    if ((iVar1 == 0x119) || (iVar1 == 0x11b)) {
      SEM_IF(paVar2);
      return;
    }
  }
  abort();
}

Assistant:

static void SEM_Stmt(struct ast *node) {
    struct ast *child1 = child(node, 1);
    switch (child1->type) {
        case Exp:
            SEM_Exp(child1);
            break;
        case CompSt:
            SEM_CompSt(child1, NULL);
            break;
        case RETURN:
            SEM_RETURN(sibling(child1, 1));
            break;
        case IF:
            SEM_IF(child1);
            break;
        case WHILE:
            SEM_WHILE(child1);
            break;
        default:
            abort();
    }
}